

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O1

jsgf_atom_t * jsgf_kleene_new(jsgf_t *jsgf,jsgf_atom_t *atom,int plus)

{
  jsgf_rhs_t *pjVar1;
  undefined8 *puVar2;
  char *pcVar3;
  glist_t pgVar4;
  jsgf_rule_t *pjVar5;
  jsgf_atom_t *pjVar6;
  
  pjVar1 = (jsgf_rhs_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0xa3);
  if (plus == 0) {
    puVar2 = (undefined8 *)
             __ckd_calloc__(1,0x18,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                            ,0x43);
    pcVar3 = "<NULL>";
  }
  else {
    pcVar3 = atom->name;
    puVar2 = (undefined8 *)
             __ckd_calloc__(1,0x18,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                            ,0x43);
  }
  pcVar3 = __ckd_salloc__(pcVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x44);
  *puVar2 = pcVar3;
  *(undefined4 *)(puVar2 + 2) = 0x3f800000;
  pgVar4 = glist_add_ptr((glist_t)0x0,puVar2);
  pjVar1->atoms = pgVar4;
  pjVar5 = jsgf_define_rule(jsgf,(char *)0x0,pjVar1,0);
  pcVar3 = pjVar5->name;
  puVar2 = (undefined8 *)
           __ckd_calloc__(1,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x43);
  pcVar3 = __ckd_salloc__(pcVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x44);
  *puVar2 = pcVar3;
  *(undefined4 *)(puVar2 + 2) = 0x3f800000;
  pjVar1 = (jsgf_rhs_t *)
           __ckd_calloc__(1,0x10,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0xaa);
  pgVar4 = glist_add_ptr((glist_t)0x0,puVar2);
  pjVar1->atoms = pgVar4;
  pgVar4 = glist_add_ptr(pgVar4,atom);
  pjVar1->atoms = pgVar4;
  pjVar5->rhs->alt = pjVar1;
  pcVar3 = pjVar5->name;
  pjVar6 = (jsgf_atom_t *)
           __ckd_calloc__(1,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x43);
  pcVar3 = __ckd_salloc__(pcVar3,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
                          ,0x44);
  pjVar6->name = pcVar3;
  pjVar6->weight = 1.0;
  return pjVar6;
}

Assistant:

jsgf_atom_t *
jsgf_kleene_new(jsgf_t * jsgf, jsgf_atom_t * atom, int plus)
{
    jsgf_rule_t *rule;
    jsgf_atom_t *rule_atom;
    jsgf_rhs_t *rhs;

    /* Generate an "internal" rule of the form (<NULL> | <name> <g0006>) */
    /* Or if plus is true, (<name> | <name> <g0006>) */
    rhs = ckd_calloc(1, sizeof(*rhs));
    if (plus)
        rhs->atoms = glist_add_ptr(NULL, jsgf_atom_new(atom->name, 1.0));
    else
        rhs->atoms = glist_add_ptr(NULL, jsgf_atom_new("<NULL>", 1.0));
    rule = jsgf_define_rule(jsgf, NULL, rhs, 0);
    rule_atom = jsgf_atom_new(rule->name, 1.0);
    rhs = ckd_calloc(1, sizeof(*rhs));
    rhs->atoms = glist_add_ptr(NULL, rule_atom);
    rhs->atoms = glist_add_ptr(rhs->atoms, atom);
    rule->rhs->alt = rhs;

    return jsgf_atom_new(rule->name, 1.0);
}